

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall icu_63::PluralFormat::setLocale(PluralFormat *this,Locale *loc,UErrorCode *status)

{
  PluralRules *pPVar1;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  Locale::operator=(&this->locale,loc);
  MessagePattern::clear(&this->msgPattern);
  if (this->numberFormat != (NumberFormat *)0x0) {
    (*(this->numberFormat->super_Format).super_UObject._vptr_UObject[1])();
  }
  this->numberFormat = (NumberFormat *)0x0;
  this->offset = 0.0;
  pPVar1 = (this->pluralRulesWrapper).pluralRules;
  if (pPVar1 != (PluralRules *)0x0) {
    (*(pPVar1->super_UObject)._vptr_UObject[1])();
  }
  (this->pluralRulesWrapper).pluralRules = (PluralRules *)0x0;
  init(this,(EVP_PKEY_CTX *)0x0);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }